

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_mark_prism_by_metric(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  double dVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT pri_tri_cell_edge [6];
  REF_INT tri_cell_edge;
  REF_DBL ratio_limit;
  REF_DBL ratio;
  REF_INT node1;
  REF_INT node0;
  REF_INT cell_edge;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_SUBDIV ref_subdiv_local;
  
  ref_cell = (REF_CELL)ref_subdiv->grid->node;
  _cell_edge = ref_subdiv->grid->cell[10];
  _ref_private_macro_code_rss_1 = 0x100000000;
  pri_tri_cell_edge[0] = 3;
  pri_tri_cell_edge[1] = 6;
  pri_tri_cell_edge[2] = 7;
  pri_tri_cell_edge[3] = 8;
  ref_node = (REF_NODE)ref_subdiv;
  dVar2 = sqrt(2.0);
  node0 = 0;
  do {
    if (_cell_edge->max <= node0) {
      return 0;
    }
    if (((-1 < node0) && (node0 < _cell_edge->max)) &&
       (_cell_edge->c2n[_cell_edge->size_per * node0] != -1)) {
      for (pri_tri_cell_edge[5] = 0; pri_tri_cell_edge[5] < 6;
          pri_tri_cell_edge[5] = pri_tri_cell_edge[5] + 1) {
        node1 = (&ref_private_macro_code_rss_1)[pri_tri_cell_edge[5]];
        ratio._4_4_ = _cell_edge->c2n[_cell_edge->e2n[node1 << 1] + _cell_edge->size_per * node0];
        ratio._0_4_ = _cell_edge->c2n[_cell_edge->e2n[node1 * 2 + 1] + _cell_edge->size_per * node0]
        ;
        uVar1 = ref_node_ratio((REF_NODE)ref_cell,ratio._4_4_,ratio._0_4_,&ratio_limit);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xf2,"ref_subdiv_mark_prism_by_metric",(ulong)uVar1,"ratio");
          return uVar1;
        }
        if ((dVar2 < ratio_limit) &&
           (uVar1 = ref_subdiv_mark_to_split((REF_SUBDIV)ref_node,ratio._4_4_,ratio._0_4_),
           uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xf4,"ref_subdiv_mark_prism_by_metric",(ulong)uVar1,"sp");
          return uVar1;
        }
      }
    }
    node0 = node0 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_prism_by_metric(REF_SUBDIV ref_subdiv) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_CELL ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));
  REF_INT cell, cell_edge;
  REF_INT node0, node1;
  REF_DBL ratio, ratio_limit;

  REF_INT tri_cell_edge;
  REF_INT pri_tri_cell_edge[] = {0, 1, 3, 6, 7, 8};

  ratio_limit = sqrt(2.0);

  each_ref_cell_valid_cell(ref_cell, cell) {
    for (tri_cell_edge = 0; tri_cell_edge < 6; tri_cell_edge++) {
      cell_edge = pri_tri_cell_edge[tri_cell_edge];
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      RSS(ref_node_ratio(ref_node, node0, node1, &ratio), "ratio");
      if (ratio > ratio_limit)
        RSS(ref_subdiv_mark_to_split(ref_subdiv, node0, node1), "sp");
    }
  }

  return REF_SUCCESS;
}